

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void dfs_range2(int head,int cur,int len)

{
  int iVar1;
  long lVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  undefined4 in_register_00000014;
  int (*paiVar5) [60];
  long lVar6;
  int *__k;
  int cur_local;
  allocator_type local_5d;
  int local_5c;
  int local_58;
  int local_54;
  undefined8 local_50;
  vector<int,_std::allocator<int>_> a;
  
  local_50 = CONCAT44(in_register_00000014,len);
  vis[cur] = true;
  local_54 = head + 100;
  local_5c = -100 - head;
  local_58 = len + 1;
  paiVar5 = Ginv;
  lVar6 = 0;
  cur_local = cur;
  do {
    lVar2 = (long)cur;
    if (inDegrees[lVar2] <= lVar6) {
      vis[lVar2] = false;
      return;
    }
    iVar1 = *(int *)((long)paiVar5 + lVar2 * 0x3c * 4);
    if ((head <= iVar1) && (vis[iVar1] == false)) {
      __k = (int *)((long)paiVar5 + lVar2 * 0x3c * 4);
      isValid[iVar1] = local_54;
      if ((int)local_50 == 2) {
        isTail[iVar1] = local_5c;
        iVar3 = std::
                _Hashtable<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&pre.
                        super__Vector_base<std::unordered_map<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::unordered_map<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[head]._M_h,__k);
        if (iVar3.
            super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
            ._M_cur == (__node_type *)0x0) {
          std::vector<int,_std::allocator<int>_>::vector(&a,1,&cur_local,&local_5d);
          pmVar4 = std::__detail::
                   _Map_base<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)(pre.
                                    super__Vector_base<std::unordered_map<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::unordered_map<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + head),__k);
          std::vector<int,_std::allocator<int>_>::operator=
                    (pmVar4,(vector<int,_std::allocator<int>_> *)
                            &a.super__Vector_base<int,_std::allocator<int>_>);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&a.super__Vector_base<int,_std::allocator<int>_>);
        }
        else {
          pmVar4 = std::__detail::
                   _Map_base<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)(pre.
                                    super__Vector_base<std::unordered_map<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::unordered_map<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + head),__k);
          std::vector<int,_std::allocator<int>_>::push_back(pmVar4,&cur_local);
        }
      }
      else if (2 < (int)local_50) goto LAB_00102848;
      dfs_range2(head,*__k,local_58);
      cur = cur_local;
    }
LAB_00102848:
    lVar6 = lVar6 + 1;
    paiVar5 = (int (*) [60])((long)paiVar5 + 4);
  } while( true );
}

Assistant:

void dfs_range2(int head, int cur, int len) {
    vis[cur] = true;
    for (int i = 0; i < inDegrees[cur]; ++i) {
        int &v = Ginv[cur][i];
        if (v < head || vis[v])continue;
        isValid[v] = head + 100;
        if (len == 2) {
            isTail[v] = -100 - head;
            if (pre[head].find(v) == pre[head].end()) {
                vector<int> a(1, cur);
                pre[head][v] = a;
            } else {
                pre[head][v].push_back(cur);
            }
        }
        if (len >= 3)continue;
        dfs_range2(head, v, len + 1);
    }
    vis[cur] = false;
}